

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterRender.cpp
# Opt level: O3

void * FilterRender::doColor
                 (void *data,uint width,uint height,u_int8_t r,u_int8_t g,u_int8_t b,u_int8_t a)

{
  ushort *puVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  
  uVar8 = (ulong)height;
  pvVar2 = operator_new__(uVar8 * 8);
  if (height != 0) {
    uVar10 = (ulong)width;
    uVar7 = 0;
    do {
      pvVar3 = operator_new__(uVar10 * 8);
      *(void **)((long)pvVar2 + uVar7 * 8) = pvVar3;
      if (width != 0) {
        uVar6 = 0;
        do {
          pvVar4 = operator_new__(4);
          *(void **)((long)pvVar3 + uVar6 * 8) = pvVar4;
          uVar6 = uVar6 + 1;
        } while (uVar10 != uVar6);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar8);
    if (height != 0) {
      uVar7 = 0;
      pvVar3 = data;
      do {
        if (width != 0) {
          lVar5 = *(long *)((long)pvVar2 + uVar7 * 8);
          uVar6 = 0;
          do {
            lVar9 = 0;
            do {
              *(undefined1 *)(*(long *)(lVar5 + uVar6 * 8) + lVar9) =
                   *(undefined1 *)((long)pvVar3 + lVar9);
              lVar9 = lVar9 + 1;
            } while (lVar9 != 4);
            pvVar3 = (void *)((long)pvVar3 + 4);
            uVar6 = uVar6 + 1;
          } while (uVar6 != uVar10);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar8);
      if (height != 0) {
        uVar7 = 0;
        do {
          if (width != 0) {
            lVar5 = *(long *)((long)pvVar2 + uVar7 * 8);
            uVar6 = 0;
            do {
              puVar1 = *(ushort **)(lVar5 + uVar6 * 8);
              dVar12 = ((double)(byte)puVar1[1] +
                       (double)(byte)(*puVar1 >> 8) + (double)(*puVar1 & 0xff)) /
                       (double)((uint)g + (uint)r + (uint)b);
              dVar11 = dVar12 * (double)b;
              if (255.0 <= dVar11) {
                dVar11 = 255.0;
              }
              *(char *)puVar1 = (char)(int)dVar11;
              dVar11 = dVar12 * (double)g;
              if (255.0 <= dVar11) {
                dVar11 = 255.0;
              }
              *(char *)(*(long *)(lVar5 + uVar6 * 8) + 1) = (char)(int)dVar11;
              dVar12 = dVar12 * (double)r;
              if (255.0 <= dVar12) {
                dVar12 = 255.0;
              }
              *(char *)(*(long *)(lVar5 + uVar6 * 8) + 2) = (char)(int)dVar12;
              uVar6 = uVar6 + 1;
            } while (uVar10 != uVar6);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar8);
        if (height != 0) {
          uVar7 = 0;
          do {
            if (width != 0) {
              uVar6 = 0;
              do {
                lVar5 = 0;
                do {
                  *(undefined1 *)((long)data + lVar5) =
                       *(undefined1 *)
                        (*(long *)(*(long *)((long)pvVar2 + uVar7 * 8) + uVar6 * 8) + lVar5);
                  lVar5 = lVar5 + 1;
                } while (lVar5 != 4);
                data = (void *)((long)data + 4);
                uVar6 = uVar6 + 1;
              } while (uVar6 != uVar10);
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 != uVar8);
          if (height != 0) {
            uVar7 = 0;
            do {
              pvVar3 = *(void **)((long)pvVar2 + uVar7 * 8);
              if (width != 0) {
                uVar8 = 0;
                do {
                  pvVar2 = *(void **)((long)pvVar3 + uVar8 * 8);
                  if (pvVar2 != (void *)0x0) {
                    operator_delete__(pvVar2);
                  }
                  uVar8 = uVar8 + 1;
                } while (uVar10 != uVar8);
LAB_00105d7e:
                operator_delete__(pvVar3);
              }
              if (pvVar3 != (void *)0x0) goto LAB_00105d7e;
              uVar7 = uVar7 + 1;
            } while (uVar7 != uVar8);
          }
        }
      }
    }
  }
  operator_delete__(pvVar2);
}

Assistant:

void* FilterRender::doColor(void *data, uint width, uint height, u_int8_t r, u_int8_t g, u_int8_t b, u_int8_t a) {
	//std::cerr << "fuckyou" << std::endl;
	unsigned char ***map;

	map = new unsigned char**[height];
	for (int i = 0; i < height; i++) {
		map[i] = new unsigned char*[width];
		for (int j = 0; j < width; j++) {
			map[i][j] = new unsigned char[4];
		}
	}

	unsigned char * p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				map[i][j][k] = *(p + k);
				// b g r a
			}
			p += 4;
		}
	}

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			double nw_sum = (1.*map[i][j][0] + map[i][j][1] + map[i][j][2])/(r+g+b);
				map[i][j][0] = std::min(255., nw_sum*b);
				map[i][j][1] = std::min(255., nw_sum*g);
				map[i][j][2] = std::min(255., nw_sum*r);
		}
	}

	p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				*(p + k) = map[i][j][k];
			}
			p += 4;
		}
	}

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			delete [] map[i][j];
		}
		delete [] map[i];
	}
	delete [] map;
	map = NULL;
}